

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

void __thiscall xercesc_4_0::ElemStack::expandStack(ElemStack *this)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  double dVar3;
  StackElem **__dest;
  
  dVar3 = (((double)CONCAT44(0x45300000,(int)(this->fStackCapacity >> 0x20)) -
           1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)this->fStackCapacity) - 4503599627370496.0)) * 1.25;
  uVar2 = (ulong)dVar3;
  uVar2 = (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar2 * 8);
  __dest = (StackElem **)CONCAT44(extraout_var,iVar1);
  memcpy(__dest,this->fStack,this->fStackCapacity << 3);
  memset(__dest + this->fStackCapacity,0,(uVar2 - this->fStackCapacity) * 8);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fStack);
  this->fStack = __dest;
  this->fStackCapacity = uVar2;
  return;
}

Assistant:

void ElemStack::expandStack()
{
    // Expand the capacity by 25% and allocate a new buffer
    const XMLSize_t newCapacity = (XMLSize_t)(fStackCapacity * 1.25);
    StackElem** newStack = (StackElem**) fMemoryManager->allocate
    (
        newCapacity * sizeof(StackElem*)
    );//new StackElem*[newCapacity];

    // Copy over the old stuff
    memcpy(newStack, fStack, fStackCapacity * sizeof(StackElem*));

    //
    //  And zero out the new stuff. Though we use a stack top, we reuse old
    //  stack contents so we need to know if elements have been initially
    //  allocated or not as we push new stuff onto the stack.
    //
    memset
    (
        &newStack[fStackCapacity]
        , 0
        , (newCapacity - fStackCapacity) * sizeof(StackElem*)
    );

    // Delete the old array and update our members
    fMemoryManager->deallocate(fStack);//delete [] fStack;
    fStack = newStack;
    fStackCapacity = newCapacity;
}